

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::DeepScanLineInputFile::Data::LineBufferTask::LineBufferTask
          (LineBufferTask *this,TaskGroup *group,Data *ifd,ScanLineProcessGroup *lineg,
          DeepFrameBuffer *outfb,exr_chunk_info_t *cinfo,int fby,int endScan,bool countsOnly)

{
  Task *pTVar1;
  Process *pPVar2;
  _func_int **in_RCX;
  TaskGroup *in_RDX;
  Task *in_RDI;
  _func_int **in_R8;
  void *in_R9;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  byte in_stack_00000018;
  TaskGroup *in_stack_ffffffffffffff98;
  ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true> *in_stack_ffffffffffffffb0;
  
  IlmThread_3_3::Task::Task(in_RDI,in_stack_ffffffffffffff98);
  in_RDI->_vptr_Task = (_func_int **)&PTR__LineBufferTask_004a6218;
  in_RDI[1]._vptr_Task = in_R8;
  in_RDI[1]._group = in_RDX;
  *(undefined4 *)&in_RDI[2]._vptr_Task = in_stack_00000008;
  *(undefined4 *)((long)&in_RDI[2]._vptr_Task + 4) = in_stack_00000010;
  pTVar1 = in_RDI + 2;
  pPVar2 = IlmThread_3_3::ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true>::pop
                     (in_stack_ffffffffffffffb0);
  pTVar1->_group = (TaskGroup *)pPVar2;
  in_RDI[3]._vptr_Task = in_RCX;
  memcpy(in_RDI[2]._group + 1,in_R9,0x40);
  *(byte *)((long)&(in_RDI[2]._group)->_data + 5) = in_stack_00000018 & 1;
  return;
}

Assistant:

LineBufferTask (
            ILMTHREAD_NAMESPACE::TaskGroup* group,
            Data*                   ifd,
            ScanLineProcessGroup*   lineg,
            const DeepFrameBuffer*  outfb,
            const exr_chunk_info_t& cinfo,
            int                     fby,
            int                     endScan,
            bool                    countsOnly)
            : Task (group)
            , _outfb (outfb)
            , _ifd (ifd)
            , _fby (fby)
            , _last_fby (endScan)
            , _line (lineg->pop ())
            , _line_group (lineg)
        {
            _line->cinfo = cinfo;
            _line->counts_only = countsOnly;
        }